

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pushDownWhereTerms(Parse *pParse,Select *pSubq,Expr *pWhere,int iCursor)

{
  Select **ppSVar1;
  int iVar2;
  Select *pSVar3;
  Expr *pEVar4;
  int iVar5;
  SubstContext x;
  Walker local_60;
  
  iVar2 = 0;
  if (pWhere != (Expr *)0x0) {
    pSVar3 = pSubq;
    if (pSubq != (Select *)0x0) {
      do {
        if ((pSVar3->selFlags & 0x2008) != 0) {
          return 0;
        }
        ppSVar1 = &pSVar3->pPrior;
        pSVar3 = *ppSVar1;
      } while (*ppSVar1 != (Select *)0x0);
    }
    if (pSubq->pLimit == (Expr *)0x0) {
      if (pWhere->op == 'G') {
        iVar5 = 0;
        do {
          iVar2 = pushDownWhereTerms(pParse,pSubq,pWhere->pRight,iCursor);
          iVar5 = iVar5 + iVar2;
          pWhere = pWhere->pLeft;
        } while (pWhere->op == 'G');
      }
      else {
        iVar5 = 0;
      }
      iVar2 = 0;
      if ((pWhere->flags & 1) == 0) {
        local_60.eCode = '\x03';
        local_60.xExprCallback = exprNodeIsConstant;
        local_60.xSelectCallback = selectNodeIsConstant;
        local_60.u.n = iCursor;
        walkExpr(&local_60,pWhere);
        iVar2 = iVar5;
        if ((local_60.eCode != '\0') && (iVar2 = iVar5 + 1, pSubq != (Select *)0x0)) {
          do {
            pEVar4 = exprDup(pParse->db,pWhere,0,(u8 **)0x0);
            local_60.xExprCallback = (_func_int_Walker_ptr_Expr_ptr *)CONCAT44(iCursor,iCursor);
            local_60.xSelectCallback =
                 (_func_int_Walker_ptr_Select_ptr *)
                 ((ulong)local_60.xSelectCallback & 0xffffffff00000000);
            local_60.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)pSubq->pEList;
            local_60.pParse = pParse;
            pEVar4 = substExpr((SubstContext *)&local_60,pEVar4);
            pEVar4 = sqlite3ExprAnd(pParse->db,pSubq->pWhere,pEVar4);
            pSubq->pWhere = pEVar4;
            pSubq = pSubq->pPrior;
          } while (pSubq != (Select *)0x0);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int pushDownWhereTerms(
  Parse *pParse,        /* Parse context (for malloc() and error reporting) */
  Select *pSubq,        /* The subquery whose WHERE clause is to be augmented */
  Expr *pWhere,         /* The WHERE clause of the outer query */
  int iCursor           /* Cursor number of the subquery */
){
  Expr *pNew;
  int nChng = 0;
  Select *pX;           /* For looping over compound SELECTs in pSubq */
  if( pWhere==0 ) return 0;
  for(pX=pSubq; pX; pX=pX->pPrior){
    if( (pX->selFlags & (SF_Aggregate|SF_Recursive))!=0 ){
      testcase( pX->selFlags & SF_Aggregate );
      testcase( pX->selFlags & SF_Recursive );
      testcase( pX!=pSubq );
      return 0; /* restrictions (1) and (2) */
    }
  }
  if( pSubq->pLimit!=0 ){
    return 0; /* restriction (3) */
  }
  while( pWhere->op==TK_AND ){
    nChng += pushDownWhereTerms(pParse, pSubq, pWhere->pRight, iCursor);
    pWhere = pWhere->pLeft;
  }
  if( ExprHasProperty(pWhere,EP_FromJoin) ) return 0; /* restriction 5 */
  if( sqlite3ExprIsTableConstant(pWhere, iCursor) ){
    nChng++;
    while( pSubq ){
      SubstContext x;
      pNew = sqlite3ExprDup(pParse->db, pWhere, 0);
      x.pParse = pParse;
      x.iTable = iCursor;
      x.iNewTable = iCursor;
      x.isLeftJoin = 0;
      x.pEList = pSubq->pEList;
      pNew = substExpr(&x, pNew);
      pSubq->pWhere = sqlite3ExprAnd(pParse->db, pSubq->pWhere, pNew);
      pSubq = pSubq->pPrior;
    }
  }
  return nChng;
}